

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_NFiles.cpp
# Opt level: O1

bool __thiscall amrex::NFilesIter::ReadyToWrite(NFilesIter *this,bool appendFirst)

{
  bool bVar1;
  
  bVar1 = this->finishedWriting;
  if (bVar1 == false) {
    std::fstream::open((char *)&this->fileStream,
                       (_Ios_Openmode)(this->fullFileName)._M_dataplus._M_p);
    if (*(int *)(&this->field_0x90 + *(long *)(*(long *)&this->fileStream + -0x18)) != 0) {
      FileOpenFailed(&this->fullFileName);
    }
  }
  return (bool)(bVar1 ^ 1);
}

Assistant:

bool NFilesIter::ReadyToWrite(bool appendFirst) {

#ifdef BL_USE_MPI

  if(finishedWriting) {
    return false;
  }

  if(useStaticSetSelection) {

    if(useSparseFPP) {

      if(mySparseFileNumber != -1) {
        if( ! appendFirst) {
          fileStream.open(fullFileName.c_str(),
                          std::ios::out | std::ios::trunc | std::ios::binary);
        } else {
          fileStream.open(fullFileName.c_str(),
                          std::ios::out | std::ios::app | std::ios::binary);
        }
        if( ! fileStream.good()) {
          amrex::FileOpenFailed(fullFileName);
        }
        return true;
      } else {
        return false;
      }


    } else {  // ---- the general static set selection

    for(int iSet(0); iSet < nSets; ++iSet) {
      if(mySetPosition == iSet) {
        if(iSet == 0 && ! appendFirst) {   // ---- first set
          fileStream.open(fullFileName.c_str(),
                          std::ios::out | std::ios::trunc | std::ios::binary);
        } else {
          fileStream.open(fullFileName.c_str(),
                          std::ios::out | std::ios::app | std::ios::binary);
        }
        if( ! fileStream.good()) {
          amrex::FileOpenFailed(fullFileName);
        }
        return true;
      }

      if(mySetPosition == (iSet + 1)) {   // ---- next set waits
        int iBuff, waitForPID(-1);
        if(groupSets) {
          waitForPID = (myProc - nOutFiles);
        } else {
          waitForPID = (myProc - 1);
        }
        ParallelDescriptor::Recv(&iBuff, 1, waitForPID, stWriteTag);
      }
    }
    }

  } else {    // ---- use dynamic set selection

    if(mySetPosition == 0) {    // ---- return true, ready to write data

      fullFileName = amrex::Concatenate(filePrefix, fileNumber, minDigits);
      if(appendFirst) {
        fileStream.open(fullFileName.c_str(),
                        std::ios::out | std::ios::app | std::ios::binary);
      } else {
        fileStream.open(fullFileName.c_str(),
                        std::ios::out | std::ios::trunc | std::ios::binary);
      }
      if( ! fileStream.good()) {
        amrex::FileOpenFailed(fullFileName);
      }
      return true;

    } else if(myProc == deciderProc) {  // ---- this proc decides who decides

      BL_PROFILE("NFI::ReadyToWrite:decider");
      // ---- the first message received is the coordinator
      ParallelDescriptor::Recv(&coordinatorProc, 1, MPI_ANY_SOURCE, deciderTag);
      for(int i(0); i < setZeroProcs.size(); ++i) {  // ---- tell the set zero ranks  who is coordinating
        ParallelDescriptor::Send(&coordinatorProc, 1, setZeroProcs[i], coordinatorTag);
      }
      unreadMessages.push_back(std::make_pair(deciderTag, setZeroProcs.size() - 1));
    }

    // ---- these are the rest of the procs who need to write
    if( ! finishedWriting) {  // ---- the deciderProc drops through to here
      // ---- wait for signal to start writing
      ParallelDescriptor::Message rmess =
            ParallelDescriptor::Recv(&fileNumber, 1, MPI_ANY_SOURCE, writeTag);
      coordinatorProc = rmess.pid();
      fullFileName = amrex::Concatenate(filePrefix, fileNumber, minDigits);

      fileStream.open(fullFileName.c_str(),
                      std::ios::out | std::ios::app | std::ios::binary);
      if( ! fileStream.good()) {
        amrex::FileOpenFailed(fullFileName);
      }
      return true;

    }

  }
  return false;

#else
  amrex::ignore_unused(appendFirst);
  if(finishedWriting) {
    return false;
  }
  fileStream.open(fullFileName.c_str(),
                  std::ios::out | std::ios::trunc | std::ios::binary);
  if( ! fileStream.good()) {
    amrex::FileOpenFailed(fullFileName);
  }
  return true;
#endif
}